

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O1

void STAT_StartNewGame(char *mapname)

{
  int iVar1;
  ulong uVar2;
  FEpisode *pFVar3;
  ulong uVar4;
  bool bVar5;
  
  if (LevelData.Count != 0) {
    TArray<OneLevel,_OneLevel>::DoDelete(&LevelData,0,LevelData.Count - 1);
    LevelData.Count = 0;
  }
  pFVar3 = AllEpisodes.Array;
  if ((deathmatch.Value == 0) && (multiplayer == false)) {
    uVar4 = (ulong)AllEpisodes.Count;
    bVar5 = uVar4 != 0;
    if (bVar5) {
      iVar1 = strcasecmp(((AllEpisodes.Array)->mEpisodeMap).Chars,mapname);
      if (iVar1 != 0) {
        uVar2 = 0;
        do {
          if (uVar4 - 1 == uVar2) {
            StartEpisode = (FEpisode *)0x0;
            return;
          }
          iVar1 = strcasecmp(pFVar3[1].mEpisodeMap.Chars,mapname);
          pFVar3 = pFVar3 + 1;
          uVar2 = uVar2 + 1;
        } while (iVar1 != 0);
        bVar5 = uVar2 < uVar4;
      }
      if (bVar5) {
        StartEpisode = pFVar3;
        return;
      }
    }
  }
  StartEpisode = (FEpisode *)0x0;
  return;
}

Assistant:

void STAT_StartNewGame(const char *mapname)
{
	LevelData.Clear();
	if (!deathmatch && !multiplayer)
	{
		for(unsigned int j=0;j<AllEpisodes.Size();j++)
		{
			if (!AllEpisodes[j].mEpisodeMap.CompareNoCase(mapname))
			{
				StartEpisode = &AllEpisodes[j];
				return;
			}
		}
	}
	StartEpisode = NULL;
}